

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::javanano::HasMapField(Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  FieldDescriptor *this;
  Descriptor *descriptor_00;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor_local;
  
  field._4_4_ = 0;
  do {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= field._4_4_) {
      return false;
    }
    this = Descriptor::field(descriptor,field._4_4_);
    TVar3 = FieldDescriptor::type(this);
    if (TVar3 == TYPE_MESSAGE) {
      descriptor_00 = FieldDescriptor::message_type(this);
      bVar1 = IsMapEntry(descriptor_00);
      if (bVar1) {
        return true;
      }
    }
    field._4_4_ = field._4_4_ + 1;
  } while( true );
}

Assistant:

bool HasMapField(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->type() == FieldDescriptor::TYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      return true;
    }
  }
  return false;
}